

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>
                   (appender out,big_decimal_fp *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,char decimal_point)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  appender aVar4;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  char cVar10;
  ulong uVar11;
  size_t sVar12;
  bool pointy;
  int num_zeros;
  sign_t sign;
  int significand_size;
  char *significand;
  int exp;
  anon_class_40_7_ef14d3db write;
  undefined1 local_7e [2];
  undefined1 local_7c [12];
  float_specs local_70;
  undefined1 local_64 [12];
  anon_class_56_7_a2a26a24 local_58;
  
  local_70 = (float_specs)fp->significand;
  local_7c._8_4_ = fp->significand_size;
  local_7c._4_4_ = ZEXT14(fspecs._5_1_);
  local_7e[0] = decimal_point;
  local_64._4_8_ = fspecs;
  if ((int)local_7c._8_4_ < 0) {
LAB_00175a8e:
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/spdlog/fmt/bundled/core.h"
                ,0x19e,"negative value");
  }
  uVar6 = (ulong)((local_7c._8_4_ + 1) - (uint)(local_7c._4_4_ == 0));
  uVar1 = fp->exponent;
  local_64._0_4_ = uVar1 + local_7c._8_4_;
  uVar9 = fspecs._4_4_;
  iVar2 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_001758c8:
    iVar7 = uVar1 + local_7c._8_4_ + -1;
    if ((uVar9 >> 0x14 & 1) == 0) {
      uVar3 = 0;
      uVar11 = (ulong)(byte)decimal_point;
      if (local_7c._8_4_ == 1) {
        uVar11 = uVar3;
      }
      cVar10 = (char)uVar11;
    }
    else {
      uVar3 = 0;
      if (0 < iVar2 - local_7c._8_4_) {
        uVar3 = (ulong)(uint)(iVar2 - local_7c._8_4_);
      }
      uVar6 = uVar6 + uVar3;
      cVar10 = decimal_point;
    }
    local_58.sign = (sign_t *)CONCAT44(local_58.sign._4_4_,(uint)fspecs._5_1_);
    local_58.significand_size._0_5_ = CONCAT14(cVar10,local_7c._8_4_);
    local_58.fp = (big_decimal_fp *)
                  (CONCAT35(local_58.fp._5_3_,CONCAT14(((uVar9 >> 0x10 & 1) == 0) << 5,(int)uVar3))
                  | 0x4500000000);
    local_58.fspecs = (float_specs *)CONCAT44(local_58.fspecs._4_4_,iVar7);
    local_58.significand = (char **)local_70;
    if (0 < specs->width) {
      if ((int)local_64._0_4_ < 1) {
        iVar7 = 1 - local_64._0_4_;
      }
      lVar8 = 2;
      if (99 < iVar7) {
        lVar8 = (ulong)(999 < iVar7) + 3;
      }
      sVar12 = uVar6 + (3 - (ulong)(cVar10 == '\0')) + lVar8;
      aVar4 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_1_&>
                        (out,specs,sVar12,sVar12,(anon_class_40_7_ef14d3db *)&local_58);
      return (appender)
             aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
    }
    aVar4 = write_float<fmt::v8::appender,_fmt::v8::detail::big_decimal_fp,_char>::
            anon_class_40_7_ef14d3db::operator()
                      ((anon_class_40_7_ef14d3db *)&local_58,
                       (iterator)
                       out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    return (appender)
           aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar7 = 0x10;
    if (0 < iVar2) {
      iVar7 = iVar2;
    }
    if (((int)local_64._0_4_ < -3) || (iVar7 < (int)local_64._0_4_)) goto LAB_001758c8;
  }
  if ((int)uVar1 < 0) {
    if (0 < (int)local_64._0_4_) {
      local_7c._0_4_ = iVar2 - local_7c._8_4_ & (int)(uVar9 << 0xb) >> 0x1f;
      local_58.decimal_point = local_7c;
      uVar3 = (ulong)(uint)local_7c._0_4_;
      if ((int)local_7c._0_4_ < 1) {
        uVar3 = 0;
      }
      sVar12 = uVar6 + uVar3 + 1;
      local_58.sign = (sign_t *)(local_7c + 4);
      local_58.significand = (char **)&local_70;
      local_58.significand_size = (int *)(local_7c + 8);
      local_58.fp = (big_decimal_fp *)local_64;
      local_58.fspecs = (float_specs *)local_7e;
      aVar4 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_3_&>
                        (out,specs,sVar12,sVar12,(anon_class_48_6_48d028d1 *)&local_58);
      return (appender)
             aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
    }
    iVar7 = -local_64._0_4_;
    local_7c._0_4_ = iVar7;
    if (SBORROW4(iVar2,iVar7) != iVar2 + local_64._0_4_ < 0) {
      local_7c._0_4_ = iVar2;
    }
    if (iVar2 < 0) {
      local_7c._0_4_ = iVar7;
    }
    if (local_7c._8_4_ != 0) {
      local_7c._0_4_ = iVar7;
    }
    if (local_7c._8_4_ == 0 && local_7c._0_4_ == 0) {
      local_7e[1] = (undefined1)((uVar9 & 0x100000) >> 0x14);
      iVar2 = 2 - (uint)(((ulong)fspecs & 0x10000000000000) == 0);
    }
    else {
      local_7e[1] = 1;
      iVar2 = 2;
      if ((int)local_7c._0_4_ < 0) goto LAB_00175a8e;
    }
    sVar12 = (uint)(iVar2 + local_7c._0_4_) + uVar6;
    local_58.sign = (sign_t *)(local_7c + 4);
    local_58.significand = (char **)(local_7e + 1);
    local_58.significand_size = (int *)local_7e;
    local_58.fp = (big_decimal_fp *)local_7c;
    local_58.fspecs = &local_70;
    local_58.decimal_point = local_7c + 8;
    bVar5.container =
         (buffer<char> *)
         write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_4_&>
                   (out,specs,sVar12,sVar12,(anon_class_48_6_d9b5e731 *)&local_58);
    return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar5.container;
  }
  sVar12 = uVar1 + uVar6;
  local_7c._0_4_ = iVar2 - local_64._0_4_;
  if ((uVar9 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_7c._0_4_) {
      if ((int)local_7c._0_4_ < 1) goto LAB_00175a09;
    }
    else {
      local_7c._0_4_ = 1;
    }
    sVar12 = sVar12 + (uint)local_7c._0_4_ + 1;
  }
LAB_00175a09:
  local_58.sign = (sign_t *)(local_7c + 4);
  local_58.significand = (char **)&local_70;
  local_58.significand_size = (int *)(local_7c + 8);
  local_58.fspecs = (float_specs *)(local_64 + 4);
  local_58.decimal_point = local_7e;
  local_58.num_zeros = (int *)local_7c;
  local_58.fp = fp;
  aVar4 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_2_&>
                    (out,specs,sVar12,sVar12,&local_58);
  return (appender)
         aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_float(OutputIt out, const DecimalFP& fp,
                 const basic_format_specs<Char>& specs, float_specs fspecs,
                 Char decimal_point) -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = detail::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}